

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O2

void duckdb::ExecuteExpression
               (idx_t elem_cnt,ColumnInfo *column_info,
               vector<duckdb::LambdaFunctions::ColumnInfo,_true> *column_infos,Vector *index_vector,
               LambdaExecuteInfo *info)

{
  DataChunk *input;
  reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  Vector *other;
  pointer this;
  idx_t i;
  ulong __n;
  long lVar4;
  bool bVar5;
  idx_t elem_cnt_local;
  vector<duckdb::Vector,_true> slices;
  Vector slice;
  
  input = &info->input_chunk;
  (info->input_chunk).count = elem_cnt;
  (info->lambda_chunk).count = elem_cnt;
  elem_cnt_local = elem_cnt;
  Vector::Vector(&slice,(column_info->vector)._M_data,&column_info->sel,elem_cnt);
  bVar5 = info->has_index == true;
  if (bVar5) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    Vector::Reference(pvVar1,index_vector);
  }
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&input->data,(ulong)bVar5);
  Vector::Reference(pvVar1,&slice);
  lVar4 = (ulong)info->has_index + 1;
  slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; __n < (ulong)(((long)(column_infos->
                                     super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                     ).
                                     super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(column_infos->
                                    super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                    ).
                                    super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>(column_infos,__n);
    if (((pvVar2->vector)._M_data)->vector_type == CONSTANT_VECTOR) {
      pvVar1 = vector<duckdb::Vector,_true>::get<true>(&input->data,lVar4 + __n);
      pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>(column_infos,__n);
      other = (pvVar2->vector)._M_data;
    }
    else {
      pvVar2 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>(column_infos,__n);
      pvVar3 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>(column_infos,__n);
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
      emplace_back<std::reference_wrapper<duckdb::Vector>const&,duckdb::SelectionVector_const&,unsigned_long_const&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&slices,&pvVar2->vector,
                 &pvVar3->sel,&elem_cnt_local);
      pvVar1 = vector<duckdb::Vector,_true>::get<true>(&input->data,lVar4 + __n);
      other = vector<duckdb::Vector,_true>::back(&slices);
    }
    Vector::Reference(pvVar1,other);
  }
  this = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
         ::operator->(&info->expr_executor);
  ExpressionExecutor::Execute(this,input,&info->lambda_chunk);
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector
            (&slices.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>);
  Vector::~Vector(&slice);
  return;
}

Assistant:

void ExecuteExpression(const idx_t elem_cnt, const LambdaFunctions::ColumnInfo &column_info,
                       const vector<LambdaFunctions::ColumnInfo> &column_infos, const Vector &index_vector,
                       LambdaExecuteInfo &info) {

	info.input_chunk.SetCardinality(elem_cnt);
	info.lambda_chunk.SetCardinality(elem_cnt);

	// slice the child vector
	Vector slice(column_info.vector, column_info.sel, elem_cnt);

	// reference the child vector (and the index vector)
	if (info.has_index) {
		info.input_chunk.data[0].Reference(index_vector);
		info.input_chunk.data[1].Reference(slice);
	} else {
		info.input_chunk.data[0].Reference(slice);
	}
	idx_t slice_offset = info.has_index ? 2 : 1;

	// (slice and) reference the other columns
	vector<Vector> slices;
	for (idx_t i = 0; i < column_infos.size(); i++) {

		if (column_infos[i].vector.get().GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// only reference constant vectorsl
			info.input_chunk.data[i + slice_offset].Reference(column_infos[i].vector);

		} else {
			// slice inconstant vectors
			slices.emplace_back(column_infos[i].vector, column_infos[i].sel, elem_cnt);
			info.input_chunk.data[i + slice_offset].Reference(slices.back());
		}
	}

	// execute the lambda expression
	info.expr_executor->Execute(info.input_chunk, info.lambda_chunk);
}